

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O0

void __thiscall
TPZStructMatrixOT<std::complex<double>_>::ThreadData::ThreadData
          (ThreadData *this,TPZStructMatrix *strmat,int seqnum,TPZBaseMatrix *rhs,
          set<int,_std::less<int>,_std::allocator<int>_> *MaterialIds,
          TPZAutoPointer<TPZGuiInterface> *guiInterface,atomic<long> *currentIndex)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  TPZAutoPointer<TPZGuiInterface> *in_R9;
  undefined8 in_stack_00000008;
  TPZAutoPointer<TPZGuiInterface> *in_stack_ffffffffffffffb8;
  
  *in_RDI = in_RSI;
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer(in_R9,in_stack_ffffffffffffffb8);
  in_RDI[2] = 0;
  in_RDI[3] = in_RCX;
  *(undefined4 *)(in_RDI + 5) = in_EDX;
  std::mutex::mutex((mutex *)0x1d89ee4);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0xc));
  in_RDI[4] = in_stack_00000008;
  return;
}

Assistant:

TPZStructMatrixOT<TVar>::ThreadData::ThreadData(
    TPZStructMatrix *strmat, int seqnum, TPZBaseMatrix &rhs,
    const std::set<int> &MaterialIds,
    TPZAutoPointer<TPZGuiInterface> guiInterface,
    std::atomic<int64_t> *currentIndex)
: fStruct(strmat),fGuiInterface(guiInterface), fGlobMatrix(0),
  fGlobRhs(&rhs), fThreadSeqNum(seqnum)
{
    this->fCurrentIndex = currentIndex;
    /*	sem_t *sem_open( ... );
     int sem_close(sem_t *sem);
     int sem_unlink(const char *name);
     */
    /*
     #ifdef MACOSX
     std::stringstream sout;
     static int counter = 0;
     sout << "AssemblySem" << counter++;
     fAssembly = sem_open(sout.str().c_str(), O_CREAT,777,1);
     if(fAssembly == SEM_FAILED)
     {
     std::cout << __PRETTY_FUNCTION__ << " could not open the semaphore\n";
     DebugStop();
     }
     #else
     int sem_result = sem_init(&fAssembly,0,0);
     if(sem_result != 0)
     {
     std::cout << __PRETTY_FUNCTION__ << " could not open the semaphore\n";
     }
     #endif
     */
}